

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O3

int GetHeadDataAndAuxDataSeanetEx
              (SEANET *pSeanet,uchar *scanline,double *pAngle,uchar *strippedauxdatabuf,
              int *pNbstrippedauxdatabytes)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  
  if (bSeanetFromFile != 0) {
    iVar1 = GetHeadDataSeanetEx(pSeanet,scanline,pAngle);
    return iVar1;
  }
  local_48 = 0xff000c4330303040;
  uStack_40 = 0x280190702;
  local_38 = 0xa00;
  iVar1 = (pSeanet->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pSeanet->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_48 + uVar4),(ulong)(0x12 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_0019f62b;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 0x12);
  }
  else {
    if (iVar1 != 0) {
LAB_0019f62b:
      puts("Error writing data to a Seanet. ");
      return 1;
    }
    iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_48 + uVar4),(ulong)(0x12 - (int)uVar4));
      if ((int)sVar2 < 1) goto LAB_0019f62b;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 0x12);
  }
  iVar1 = HeadDataReplyAndAuxDataSeanet
                    (pSeanet,scanline,pAngle,strippedauxdatabuf,pNbstrippedauxdatabytes);
  return (uint)(iVar1 != 0);
}

Assistant:

int GetHeadDataAndAuxDataSeanetEx(SEANET* pSeanet,
	unsigned char* scanline, double* pAngle,
	unsigned char* strippedauxdatabuf, int* pNbstrippedauxdatabytes)
{
	if (!bSeanetFromFile) return GetHeadDataAndAuxDataSeanet(pSeanet, scanline, pAngle, strippedauxdatabuf, pNbstrippedauxdatabytes);
	else return GetHeadDataSeanetEx(pSeanet, scanline, pAngle);
}